

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupSelf(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar1 = Gia_ManAppendCi(p_00);
  for (iVar8 = 0; iVar8 < p->vCis->nSize; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCi(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar2;
  }
  for (iVar8 = 0; iVar8 < p->nObjs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManObj(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar3 = Gia_ObjFanin0Copy(pGVar5);
      iLit1 = Gia_ObjFanin1Copy(pGVar5);
      uVar2 = Gia_ManHashAnd(p_00,iVar3,iLit1);
      pGVar5->Value = uVar2;
    }
  }
  for (iVar8 = 0; iVar8 < p->vCos->nSize - p->nRegs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCo(p,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ObjFanin0Copy(pGVar5);
    pGVar5->Value = uVar2;
  }
  for (iVar8 = 0; iVar8 < p->nRegs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjFanin0Copy(pGVar5);
    pGVar6 = Gia_ObjRiToRo(p,pGVar5);
    uVar2 = Gia_ManHashMux(p_00,iVar1,iVar3,pGVar6->Value);
    pGVar5->Value = uVar2;
  }
  for (iVar1 = 0; iVar1 < p->vCos->nSize; iVar1 = iVar1 + 1) {
    pGVar5 = Gia_ManCo(p,iVar1);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    Gia_ManAppendCo(p_00,pGVar5->Value);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar7 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManDupSelf( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp; 
    Gia_Obj_t * pObj;
    int i, iCtrl;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    iCtrl = Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManHashMux( pNew, iCtrl, Gia_ObjFanin0Copy(pObj), Gia_ObjRiToRo(p, pObj)->Value );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}